

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

DdNode * Llb_Nonlin4ComputeInitState(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  int iVar1;
  abctime aVar2;
  uint uVar3;
  DdNode *pDVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  DdNode *f;
  
  aVar2 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar4 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar4);
  if (0 < pAig->nRegs) {
    iVar7 = 0;
    f = pDVar4;
    do {
      uVar3 = pAig->nTruePos + iVar7;
      if (((((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) ||
          (uVar6 = pAig->nTruePis + iVar7, (int)uVar6 < 0)) || (pAig->vCis->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (fBackward == 0) {
        pvVar5 = pAig->vCis->pArray[uVar6];
      }
      else {
        pvVar5 = pAig->vCos->pArray[uVar3];
      }
      iVar1 = *(int *)((long)pvVar5 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar4 = Cudd_bddIthVar(dd,vOrder->pArray[iVar1]);
      pDVar4 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)pDVar4 ^ 1));
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,f);
      iVar7 = iVar7 + 1;
      f = pDVar4;
    } while (iVar7 < pAig->nRegs);
  }
  Cudd_Deref(pDVar4);
  dd->TimeStop = aVar2;
  return pDVar4;
}

Assistant:

DdNode * Llb_Nonlin4ComputeInitState( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo) );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}